

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::SimpleModifier::SimpleModifier
          (SimpleModifier *this,SimpleFormatter *simpleFormatter,Field field,bool strong,
          Parameters parameters)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  char16_t *pcVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  
  uVar7 = parameters._8_8_;
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_003f45e0;
  UnicodeString::UnicodeString(&this->fCompiledPattern,&simpleFormatter->compiledPattern);
  this->fField = field;
  this->fStrong = strong;
  this->fPrefixLength = 0;
  this->fSuffixOffset = -1;
  this->fSuffixLength = 0;
  (this->fParameters).obj = parameters.obj;
  (this->fParameters).signum = (char)uVar7;
  *(int3 *)&(this->fParameters).field_0x9 = (int3)((ulong)uVar7 >> 8);
  (this->fParameters).plural = (int)((ulong)uVar7 >> 0x20);
  uVar1 = (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar4 = (this->fCompiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar4 = (this->fCompiledPattern).fUnion.fStackFields.fBuffer;
    }
  }
  else {
    pcVar4 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar6 = (this->fCompiledPattern).fUnion.fFields.fLength;
  }
  else {
    uVar6 = (int)(short)uVar1 >> 5;
  }
  if ((uVar6 == 0) || (*pcVar4 == L'\0')) {
    iVar5 = 0xfeff;
    if (1 < uVar6) {
      if ((uVar1 & 2) == 0) {
        pcVar4 = (this->fCompiledPattern).fUnion.fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
      }
      iVar5 = (ushort)pcVar4[1] - 0x100;
    }
    this->fPrefixLength = iVar5;
    this->fSuffixOffset = -1;
    iVar5 = 0;
    goto LAB_002742ed;
  }
  uVar3 = 0xffff;
  if (uVar6 == 1) {
LAB_00274299:
    this->fPrefixLength = uVar3 - 0x100;
    uVar3 = uVar3 - 0xfd;
  }
  else {
    if ((uVar1 & 2) == 0) {
      pcVar4 = (this->fCompiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
    }
    if (pcVar4[1] != L'\0') {
      if (uVar6 != 1) {
        if ((uVar1 & 2) == 0) {
          pcVar4 = (this->fCompiledPattern).fUnion.fFields.fArray;
        }
        else {
          pcVar4 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
        }
        uVar3 = (uint)(ushort)pcVar4[1];
      }
      goto LAB_00274299;
    }
    this->fPrefixLength = 0;
    uVar3 = 2;
  }
  this->fSuffixOffset = uVar3;
  sVar2 = (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    uVar6 = (this->fCompiledPattern).fUnion.fFields.fLength;
  }
  else {
    uVar6 = (int)sVar2 >> 5;
  }
  iVar5 = 0;
  if ((this->fPrefixLength + 3 < (int)uVar6) && (iVar5 = 0xfeff, uVar3 < uVar6)) {
    if (((int)sVar2 & 2U) == 0) {
      pcVar4 = (this->fCompiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
    }
    iVar5 = (ushort)pcVar4[(int)uVar3] - 0x100;
  }
LAB_002742ed:
  this->fSuffixLength = iVar5;
  return;
}

Assistant:

SimpleModifier::SimpleModifier(const SimpleFormatter &simpleFormatter, Field field, bool strong,
                               const Modifier::Parameters parameters)
        : fCompiledPattern(simpleFormatter.compiledPattern), fField(field), fStrong(strong),
          fParameters(parameters) {
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            fCompiledPattern.getBuffer(), fCompiledPattern.length());
    if (argLimit == 0) {
        // No arguments in compiled pattern
        fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
        U_ASSERT(2 + fPrefixLength == fCompiledPattern.length());
        // Set suffixOffset = -1 to indicate no arguments in compiled pattern.
        fSuffixOffset = -1;
        fSuffixLength = 0;
    } else {
        U_ASSERT(argLimit == 1);
        if (fCompiledPattern.charAt(1) != 0) {
            // Found prefix
            fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
            fSuffixOffset = 3 + fPrefixLength;
        } else {
            // No prefix
            fPrefixLength = 0;
            fSuffixOffset = 2;
        }
        if (3 + fPrefixLength < fCompiledPattern.length()) {
            // Found suffix
            fSuffixLength = fCompiledPattern.charAt(fSuffixOffset) - ARG_NUM_LIMIT;
        } else {
            // No suffix
            fSuffixLength = 0;
        }
    }
}